

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_decals.cpp
# Opt level: O2

ON_3dVector * __thiscall
ON_Decal::CImpl::VectorAcross(ON_3dVector *__return_storage_ptr__,CImpl *this)

{
  ON_3dVector *v;
  double dVar1;
  bool bVar2;
  ON_3dPoint OStack_228;
  ON_XMLVariant local_210;
  ON_XMLVariant local_118;
  
  v = &(this->_cache).vector_across;
  bVar2 = ON_3dVector::operator==(&ON_3dVector::UnsetVector,v);
  if (bVar2) {
    ::ON_XMLVariant::ON_XMLVariant(&local_118,&ON_3dPoint::Origin);
    GetParameter(&local_210,this,L"vector-across",&local_118);
    ::ON_XMLVariant::As3dPoint(&OStack_228,&local_210);
    ON_3dVector::operator=(v,&OStack_228);
    ::ON_XMLVariant::~ON_XMLVariant(&local_210);
    ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  }
  __return_storage_ptr__->z = (this->_cache).vector_across.z;
  dVar1 = (this->_cache).vector_across.y;
  __return_storage_ptr__->x = v->x;
  __return_storage_ptr__->y = dVar1;
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Decal::CImpl::VectorAcross(void) const
{
  if (ON_3dVector::UnsetVector == _cache.vector_across)
  {
     _cache.vector_across = GetParameter(ON_RDK_DECAL_VECTOR_ACROSS, ON_3dPoint::Origin).As3dPoint();
  }

  return _cache.vector_across;
}